

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O1

void anon_unknown.dwarf_e4ae9::allocatePixels
               (int type,Array2D<unsigned_int> *sampleCount,Array2D<unsigned_int_*> *uintData,
               Array2D<float_*> *floatData,Array2D<Imath_3_2::half_*> *halfData,int width,int height
               )

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  ulong uVar6;
  sbyte sVar7;
  long lVar8;
  half ***ppphVar9;
  long lVar10;
  ulong uVar11;
  long local_88;
  
  if (0 < height) {
    lVar10 = 0;
    local_88 = 0;
    uVar6 = 0;
    do {
      if (0 < width) {
        lVar1 = halfData->_sizeY;
        lVar2 = floatData->_sizeY;
        lVar3 = uintData->_sizeY;
        lVar4 = sampleCount->_sizeY;
        uVar11 = 0;
        do {
          sVar7 = 2;
          lVar8 = lVar3;
          ppphVar9 = (half ***)&uintData->_data;
          if (type == 0) {
LAB_0014b8e5:
            pvVar5 = operator_new__((ulong)*(uint *)((long)sampleCount->_data +
                                                    uVar11 * 4 + lVar4 * local_88) << sVar7);
            *(void **)((long)*ppphVar9 + uVar11 * 8 + lVar8 * lVar10) = pvVar5;
          }
          else {
            if (type == 2) {
              sVar7 = 1;
              lVar8 = lVar1;
              ppphVar9 = &halfData->_data;
              goto LAB_0014b8e5;
            }
            lVar8 = lVar2;
            ppphVar9 = (half ***)&floatData->_data;
            if (type == 1) goto LAB_0014b8e5;
          }
          uVar11 = uVar11 + 1;
        } while ((uint)width != uVar11);
      }
      uVar6 = uVar6 + 1;
      local_88 = local_88 + 4;
      lVar10 = lVar10 + 8;
    } while (uVar6 != (uint)height);
  }
  return;
}

Assistant:

void
allocatePixels (
    int                     type,
    Array2D<unsigned int>&  sampleCount,
    Array2D<unsigned int*>& uintData,
    Array2D<float*>&        floatData,
    Array2D<half*>&         halfData,
    int                     width,
    int                     height)
{
    allocatePixels (
        type,
        sampleCount,
        uintData,
        floatData,
        halfData,
        0,
        width - 1,
        0,
        height - 1);
}